

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

Cba_Man_t * Cba_ManCollapse(Cba_Man_t *p)

{
  char *pFileName;
  Vec_Int_t *pVVar1;
  Cba_Ntk_t *p_00;
  int iVar2;
  int iVar3;
  int nOuts;
  Abc_Nam_t *pStrs;
  Abc_Nam_t *pFuns;
  Abc_Nam_t *pMods;
  Hash_IntMan_t *vHash;
  int *piVar4;
  int local_4c;
  int local_48;
  int nFons;
  int nFins;
  int nObjs;
  int iFon;
  int iObjNew;
  int iObj;
  int i;
  Vec_Int_t *vSigs;
  Cba_Ntk_t *pRootNew;
  Cba_Ntk_t *pRoot;
  Cba_Man_t *pNew;
  Cba_Man_t *p_local;
  
  pFileName = p->pSpec;
  pNew = p;
  pStrs = Abc_NamRef(p->pStrs);
  pFuns = Abc_NamRef(pNew->pFuns);
  pMods = Abc_NamStart(100,0x18);
  vHash = Hash_IntManRef(pNew->vHash);
  pRoot = (Cba_Ntk_t *)Cba_ManAlloc(pFileName,1,pStrs,pFuns,pMods,vHash);
  pRootNew = Cba_ManRoot(pNew);
  _iObj = Vec_IntAlloc(1000);
  nFons = 0;
  local_48 = 0;
  local_4c = 0;
  Cba_ManDupTypeNames((Cba_Man_t *)pRoot,pNew);
  Cba_ManGetClpStats(pNew,&nFons,&local_48,&local_4c);
  p_00 = pRoot;
  iVar2 = Cba_NtkNameId(pRootNew);
  iVar3 = Cba_NtkPiNum(pRootNew);
  nOuts = Cba_NtkPoNum(pRootNew);
  vSigs = (Vec_Int_t *)Cba_NtkAlloc((Cba_Man_t *)p_00,iVar2,iVar3,nOuts,nFons,local_48,local_4c);
  Cba_NtkAdd((Cba_Man_t *)pRoot,(Cba_Ntk_t *)vSigs);
  iVar2 = Cba_NtkHasObjNames(pRootNew);
  if (iVar2 != 0) {
    Cba_NtkCleanObjNames((Cba_Ntk_t *)vSigs);
  }
  iVar2 = Cba_NtkHasFonNames(pRootNew);
  if (iVar2 != 0) {
    Cba_NtkCleanFonNames((Cba_Ntk_t *)vSigs);
  }
  iVar2 = Cba_NtkHasObjAttrs(pRootNew);
  if (iVar2 != 0) {
    Cba_NtkCleanObjAttrs((Cba_Ntk_t *)vSigs);
  }
  iVar2 = Cba_ObjAttr(pRootNew,0);
  pVVar1 = vSigs;
  if (iVar2 != 0) {
    piVar4 = Cba_ObjAttrArray(pRootNew,0);
    iVar2 = Cba_ObjAttrSize(pRootNew,0);
    Cba_ObjSetAttrs((Cba_Ntk_t *)pVVar1,0,piVar4,iVar2);
  }
  Cba_NtkCleanObjCopies(pRootNew);
  for (iObjNew = 0; iVar2 = iObjNew, iVar3 = Cba_NtkPiNum(pRootNew), iVar2 < iVar3;
      iObjNew = iObjNew + 1) {
    iFon = Cba_NtkPi(pRootNew,iObjNew);
    nFins = Cba_ObjFon0(pRootNew,iFon);
    nObjs = Cba_ObjDup((Cba_Ntk_t *)vSigs,pRootNew,iFon);
    pVVar1 = _iObj;
    iVar2 = Cba_ObjFon0((Cba_Ntk_t *)vSigs,nObjs);
    Vec_IntPush(pVVar1,iVar2);
    iVar3 = Cba_NtkHasObjNames(pRootNew);
    pVVar1 = vSigs;
    iVar2 = nObjs;
    if (iVar3 != 0) {
      iVar3 = Cba_ObjName(pRootNew,iFon);
      Cba_ObjSetName((Cba_Ntk_t *)pVVar1,iVar2,iVar3);
    }
    iVar2 = Cba_NtkHasFonNames(pRootNew);
    pVVar1 = vSigs;
    if (iVar2 != 0) {
      iVar2 = Cba_ObjFon0((Cba_Ntk_t *)vSigs,nObjs);
      iVar3 = Cba_FonName(pRootNew,nFins);
      Cba_FonSetName((Cba_Ntk_t *)pVVar1,iVar2,iVar3);
    }
    iVar3 = Cba_ObjAttr(pRootNew,iFon);
    pVVar1 = vSigs;
    iVar2 = nObjs;
    if (iVar3 != 0) {
      piVar4 = Cba_ObjAttrArray(pRootNew,iFon);
      iVar3 = Cba_ObjAttrSize(pRootNew,iFon);
      Cba_ObjSetAttrs((Cba_Ntk_t *)pVVar1,iVar2,piVar4,iVar3);
    }
  }
  iVar2 = Vec_IntSize(_iObj);
  iVar3 = Cba_NtkPiNum(pRootNew);
  if (iVar2 != iVar3) {
    __assert_fail("Vec_IntSize(vSigs) == Cba_NtkPiNum(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x331,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  Cba_NtkCollapse_rec((Cba_Ntk_t *)vSigs,pRootNew,_iObj);
  iVar2 = Vec_IntSize(_iObj);
  iVar3 = Cba_NtkPoNum(pRootNew);
  if (iVar2 != iVar3) {
    __assert_fail("Vec_IntSize(vSigs) == Cba_NtkPoNum(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x333,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  for (iObjNew = 0; iVar2 = iObjNew, iVar3 = Cba_NtkPoNum(pRootNew), iVar2 < iVar3;
      iObjNew = iObjNew + 1) {
    iFon = Cba_NtkPo(pRootNew,iObjNew);
    nFins = Cba_ObjFinFon(pRootNew,iFon,0);
    iVar2 = Cba_ObjDup((Cba_Ntk_t *)vSigs,pRootNew,iFon);
    pVVar1 = vSigs;
    nObjs = iVar2;
    iVar3 = Vec_IntEntry(_iObj,iObjNew);
    Cba_ObjSetFinFon((Cba_Ntk_t *)pVVar1,iVar2,0,iVar3);
    iVar3 = Cba_NtkHasObjNames(pRootNew);
    pVVar1 = vSigs;
    iVar2 = nObjs;
    if (iVar3 != 0) {
      iVar3 = Cba_ObjName(pRootNew,iFon);
      Cba_ObjSetName((Cba_Ntk_t *)pVVar1,iVar2,iVar3);
    }
    iVar2 = Cba_NtkHasFonNames(pRootNew);
    pVVar1 = vSigs;
    if (iVar2 != 0) {
      iVar2 = Vec_IntEntry(_iObj,iObjNew);
      iVar3 = Cba_FonName(pRootNew,nFins);
      Cba_FonSetName((Cba_Ntk_t *)pVVar1,iVar2,iVar3);
    }
    iVar3 = Cba_ObjAttr(pRootNew,iFon);
    pVVar1 = vSigs;
    iVar2 = nObjs;
    if (iVar3 != 0) {
      piVar4 = Cba_ObjAttrArray(pRootNew,iFon);
      iVar3 = Cba_ObjAttrSize(pRootNew,iFon);
      Cba_ObjSetAttrs((Cba_Ntk_t *)pVVar1,iVar2,piVar4,iVar3);
    }
  }
  Vec_IntFree(_iObj);
  iVar2 = Cba_NtkObjNum((Cba_Ntk_t *)vSigs);
  iVar3 = Cba_NtkObjNumAlloc((Cba_Ntk_t *)vSigs);
  if (iVar2 == iVar3) {
    iVar2 = Cba_NtkFinNum((Cba_Ntk_t *)vSigs);
    iVar3 = Cba_NtkFinNumAlloc((Cba_Ntk_t *)vSigs);
    if (iVar2 != iVar3) {
      __assert_fail("Cba_NtkFinNum(pRootNew) == Cba_NtkFinNumAlloc(pRootNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                    ,0x341,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
    }
    iVar2 = Cba_NtkFonNum((Cba_Ntk_t *)vSigs);
    iVar3 = Cba_NtkFonNumAlloc((Cba_Ntk_t *)vSigs);
    if (iVar2 == iVar3) {
      Cba_NtkMissingFonNames((Cba_Ntk_t *)vSigs,"m");
      return (Cba_Man_t *)pRoot;
    }
    __assert_fail("Cba_NtkFonNum(pRootNew) == Cba_NtkFonNumAlloc(pRootNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x342,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
  }
  __assert_fail("Cba_NtkObjNum(pRootNew) == Cba_NtkObjNumAlloc(pRootNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                ,0x340,"Cba_Man_t *Cba_ManCollapse(Cba_Man_t *)");
}

Assistant:

Cba_Man_t * Cba_ManCollapse( Cba_Man_t * p )
{
    Cba_Man_t * pNew  = Cba_ManAlloc( p->pSpec, 1, Abc_NamRef(p->pStrs), Abc_NamRef(p->pFuns), Abc_NamStart(100, 24), Hash_IntManRef(p->vHash) );
    Cba_Ntk_t * pRoot = Cba_ManRoot( p ), * pRootNew;
    Vec_Int_t * vSigs = Vec_IntAlloc( 1000 );
    int i, iObj, iObjNew, iFon, nObjs = 0, nFins = 0, nFons = 0;
    Cba_ManDupTypeNames( pNew, p );
    Cba_ManGetClpStats( p, &nObjs, &nFins, &nFons    );
    pRootNew = Cba_NtkAlloc( pNew, Cba_NtkNameId(pRoot), Cba_NtkPiNum(pRoot), Cba_NtkPoNum(pRoot), nObjs, nFins, nFons );
    Cba_NtkAdd( pNew, pRootNew );
    if ( Cba_NtkHasObjNames(pRoot) )
        Cba_NtkCleanObjNames( pRootNew );
    if ( Cba_NtkHasFonNames(pRoot) )
        Cba_NtkCleanFonNames( pRootNew );
    if ( Cba_NtkHasObjAttrs(pRoot) )
        Cba_NtkCleanObjAttrs( pRootNew );
    if ( Cba_ObjAttr(pRoot, 0) )
        Cba_ObjSetAttrs( pRootNew, 0, Cba_ObjAttrArray(pRoot, 0), Cba_ObjAttrSize(pRoot, 0) );
    Cba_NtkCleanObjCopies( pRoot );
    Cba_NtkForEachPiFon( pRoot, iObj, iFon, i )
    {
        iObjNew = Cba_ObjDup( pRootNew, pRoot, iObj );
        Vec_IntPush( vSigs, Cba_ObjFon0(pRootNew, iObjNew) );
        if ( Cba_NtkHasObjNames(pRoot) )
            Cba_ObjSetName( pRootNew, iObjNew, Cba_ObjName(pRoot, iObj) );
        if ( Cba_NtkHasFonNames(pRoot) )
            Cba_FonSetName( pRootNew, Cba_ObjFon0(pRootNew, iObjNew), Cba_FonName(pRoot, iFon) );
        if ( Cba_ObjAttr(pRoot, iObj) )
            Cba_ObjSetAttrs( pRootNew, iObjNew, Cba_ObjAttrArray(pRoot, iObj), Cba_ObjAttrSize(pRoot, iObj) );
    }
    assert( Vec_IntSize(vSigs) == Cba_NtkPiNum(pRoot) );
    Cba_NtkCollapse_rec( pRootNew, pRoot, vSigs );
    assert( Vec_IntSize(vSigs) == Cba_NtkPoNum(pRoot) );
    Cba_NtkForEachPoDriverFon( pRoot, iObj, iFon, i )
    {
        iObjNew = Cba_ObjDup( pRootNew, pRoot, iObj );
        Cba_ObjSetFinFon( pRootNew, iObjNew, 0, Vec_IntEntry(vSigs, i) );
        if ( Cba_NtkHasObjNames(pRoot) )
            Cba_ObjSetName( pRootNew, iObjNew, Cba_ObjName(pRoot, iObj) );
        if ( Cba_NtkHasFonNames(pRoot) )
            Cba_FonSetName( pRootNew, Vec_IntEntry(vSigs, i), Cba_FonName(pRoot, iFon) );
        if ( Cba_ObjAttr(pRoot, iObj) )
            Cba_ObjSetAttrs( pRootNew, iObjNew, Cba_ObjAttrArray(pRoot, iObj), Cba_ObjAttrSize(pRoot, iObj) );
    }
    Vec_IntFree( vSigs );
    assert( Cba_NtkObjNum(pRootNew) == Cba_NtkObjNumAlloc(pRootNew) );
    assert( Cba_NtkFinNum(pRootNew) == Cba_NtkFinNumAlloc(pRootNew) );
    assert( Cba_NtkFonNum(pRootNew) == Cba_NtkFonNumAlloc(pRootNew) );
    // create internal node names
    Cba_NtkMissingFonNames( pRootNew, "m" );
    //Cba_NtkPrepareSeq( pRootNew );
    return pNew;
}